

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O3

void free_okt(IFF_CHUNKED *mod)

{
  void *__ptr;
  uint uVar1;
  IFF_CHUNK *__ptr_00;
  long lVar2;
  ulong uVar3;
  
  if (mod != (IFF_CHUNKED *)0x0) {
    __ptr_00 = mod->chunks;
    if (__ptr_00 != (IFF_CHUNK *)0x0) {
      uVar1 = mod->chunk_count;
      if (uVar1 != 0) {
        lVar2 = 8;
        uVar3 = 0;
        do {
          __ptr = *(void **)((long)&mod->chunks->type + lVar2);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            uVar1 = mod->chunk_count;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 < uVar1);
        __ptr_00 = mod->chunks;
      }
      free(__ptr_00);
    }
    free(mod);
    return;
  }
  return;
}

Assistant:

void free_okt(IFF_CHUNKED * mod)
{
	unsigned i;
	if (mod)
	{
		if (mod->chunks)
		{
			for (i = 0; i < mod->chunk_count; i++)
			{
				if (mod->chunks[i].data) free(mod->chunks[i].data);
			}
			free(mod->chunks);
		}
		free(mod);
	}
}